

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::ReportReflectionUsageTypeError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,CppType expected_type)

{
  CppType CVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_6d [13];
  LogMessage local_60;
  CppType local_24;
  char *pcStack_20;
  CppType expected_type_local;
  char *method_local;
  FieldDescriptor *field_local;
  Descriptor *descriptor_local;
  
  local_24 = expected_type;
  pcStack_20 = method;
  method_local = (char *)field;
  field_local = (FieldDescriptor *)descriptor;
  internal::LogMessage::LogMessage
            (&local_60,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0x95);
  pLVar2 = internal::LogMessage::operator<<
                     (&local_60,
                      "Protocol Buffer reflection usage error:\n  Method      : google::protobuf::Reflection::"
                     );
  pLVar2 = internal::LogMessage::operator<<(pLVar2,pcStack_20);
  pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n  Message type: ");
  psVar3 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_local);
  pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
  pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n  Field       : ");
  psVar3 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)method_local);
  pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
  pLVar2 = internal::LogMessage::operator<<
                     (pLVar2,
                      "\n  Problem     : Field is not the right type for this message:\n    Expected  : "
                     );
  pLVar2 = internal::LogMessage::operator<<
                     (pLVar2,*(char **)((anonymous_namespace)::cpptype_names_ + (ulong)local_24 * 8)
                     );
  pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n    Field type: ");
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)method_local);
  pLVar2 = internal::LogMessage::operator<<
                     (pLVar2,*(char **)((anonymous_namespace)::cpptype_names_ + (ulong)CVar1 * 8));
  internal::LogFinisher::operator=(local_6d,pLVar2);
  internal::LogMessage::~LogMessage(&local_60);
  return;
}

Assistant:

static void ReportReflectionUsageTypeError(
    const Descriptor* descriptor, const FieldDescriptor* field,
    const char* method, FieldDescriptor::CppType expected_type) {
  GOOGLE_LOG(FATAL)
      << "Protocol Buffer reflection usage error:\n"
         "  Method      : google::protobuf::Reflection::"
      << method
      << "\n"
         "  Message type: "
      << descriptor->full_name()
      << "\n"
         "  Field       : "
      << field->full_name()
      << "\n"
         "  Problem     : Field is not the right type for this message:\n"
         "    Expected  : "
      << cpptype_names_[expected_type]
      << "\n"
         "    Field type: "
      << cpptype_names_[field->cpp_type()];
}